

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_p.h
# Opt level: O2

QStorageInfo QStorageInfoPrivate::root(void)

{
  QExplicitlySharedDataPointer<QStorageInfoPrivate> in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (Data *)0x0;
  local_40.d = (Data *)0x0;
  local_40.ptr = (char16_t *)0x0;
  local_28.ptr = L"/";
  local_40.size = 0;
  local_28.size = 1;
  QStorageInfo::QStorageInfo((QStorageInfo *)in_RDI.d.ptr,(QString *)&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QExplicitlySharedDataPointer<QStorageInfoPrivate>)
           (QExplicitlySharedDataPointer<QStorageInfoPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

static QStorageInfo root()
    {
#ifdef Q_OS_WIN
        return QStorageInfo(QDir::fromNativeSeparators(QFile::decodeName(qgetenv("SystemDrive"))));
#else
        return QStorageInfo(QStringLiteral("/"));
#endif
    }